

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

bool __thiscall QGraphicsItem::isUnderMouse(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  QWidget *this_00;
  QGraphicsView **ppQVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QPointF QVar8;
  QPoint local_80;
  QPointF local_78;
  qreal local_68;
  qreal local_60;
  QArrayDataPointer<QGraphicsView_*> local_58;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  if (pQVar1->scene == (QGraphicsScene *)0x0) {
    bVar4 = false;
  }
  else {
    local_40 = (QPoint)QCursor::pos();
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsScene::views((QList<QGraphicsView_*> *)&local_58,(QGraphicsScene *)pQVar1->scene);
    ppQVar2 = local_58.ptr;
    lVar5 = local_58.size << 3;
    lVar6 = 0;
    do {
      bVar7 = lVar5 == lVar6;
      bVar4 = !bVar7;
      if (bVar7) break;
      this_00 = *(QWidget **)((long)ppQVar2 + lVar6);
      local_80 = QWidget::mapFromGlobal(this_00,&local_40);
      QVar8 = QGraphicsView::mapToScene((QGraphicsView *)this_00,&local_80);
      local_78.yp = QVar8.yp;
      local_78.xp = QVar8.xp;
      QVar8 = mapFromScene(this,&local_78);
      local_60 = QVar8.yp;
      local_68 = QVar8.xp;
      iVar3 = (*this->_vptr_QGraphicsItem[5])(this,&local_68);
      lVar6 = lVar6 + 8;
    } while ((char)iVar3 == '\0');
    QArrayDataPointer<QGraphicsView_*>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsItem::isUnderMouse() const
{
    Q_D(const QGraphicsItem);
    if (!d->scene)
        return false;

    QPoint cursorPos = QCursor::pos();
    const auto views = d->scene->views();
    for (QGraphicsView *view : views) {
        if (contains(mapFromScene(view->mapToScene(view->mapFromGlobal(cursorPos)))))
            return true;
    }
    return false;
}